

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O1

yrmcds_error yrmcds_close(yrmcds *c)

{
  yrmcds_error yVar1;
  
  if (c == (yrmcds *)0x0) {
    yVar1 = YRMCDS_BAD_ARGUMENT;
  }
  else if (c->sock == -1) {
    yVar1 = YRMCDS_OK;
  }
  else {
    close(c->sock);
    c->sock = -1;
    pthread_mutex_destroy((pthread_mutex_t *)&c->lock);
    free(c->recvbuf);
    yVar1 = YRMCDS_OK;
    c->recvbuf = (char *)0x0;
    free(c->decompressed);
    c->decompressed = (char *)0x0;
  }
  return yVar1;
}

Assistant:

yrmcds_error yrmcds_close(yrmcds* c) {
    if( c == NULL )
        return YRMCDS_BAD_ARGUMENT;
    if( c->sock == -1 )
        return YRMCDS_OK;

    close(c->sock);
    c->sock = -1;
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
    pthread_mutex_destroy(&(c->lock));
#endif
    free(c->recvbuf);
    c->recvbuf = NULL;
    free(c->decompressed);
    c->decompressed = NULL;
    return YRMCDS_OK;
}